

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

char * CVmRun::get_exc_message(vm_obj_id_t exc_obj,size_t *msg_len)

{
  int iVar1;
  ushort *puVar2;
  uint argc;
  vm_val_t val;
  vm_obj_id_t src_obj;
  undefined4 local_2c;
  int local_28 [2];
  uint local_20;
  undefined1 local_14 [4];
  
  if (exc_obj == 0) {
    return (char *)0x0;
  }
  local_2c = 0;
  if ((G_predef_X.rterrmsg_prop != 0) &&
     (iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[exc_obj >> 0xc][exc_obj & 0xfff].ptr_ +
                          0x68))(G_obj_table_X.pages_[exc_obj >> 0xc] + (exc_obj & 0xfff),
                                 G_predef_X.rterrmsg_prop,local_28,exc_obj,local_14,&local_2c),
     iVar1 != 0)) {
    if (local_28[0] == 5) {
      puVar2 = (ushort *)
               (**(code **)(*(long *)&G_obj_table_X.pages_[local_20 >> 0xc][local_20 & 0xfff].ptr_ +
                           0x1a8))(G_obj_table_X.pages_[local_20 >> 0xc] + (local_20 & 0xfff));
    }
    else {
      if (local_28[0] != 8) {
        return (char *)0x0;
      }
      puVar2 = (ushort *)
               (G_const_pool_X.super_CVmPoolPaged.pages_
                [local_20 >> ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem +
               (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & local_20));
    }
    if (puVar2 != (ushort *)0x0) {
      *msg_len = (ulong)*puVar2;
      return (char *)(puVar2 + 1);
    }
  }
  return (char *)0x0;
}

Assistant:

const char *CVmRun::get_exc_message(VMG_ vm_obj_id_t exc_obj, size_t *msg_len)
{
    vm_val_t val;
    vm_obj_id_t src_obj;
    const char *str;
    uint argc;
    
    /* if there's no object, there's no message */
    if (exc_obj == VM_INVALID_OBJ)
        return 0;
    
    /* 
     *   get the exceptionMessage property value from the object; if
     *   there's not a valid exceptionMessage property defined, or the
     *   object doesn't have a value for the property, there's no message 
     */
    argc = 0;
    if (G_predef->rterrmsg_prop == VM_INVALID_PROP
        || (!vm_objp(vmg_ exc_obj)->get_prop(vmg_ G_predef->rterrmsg_prop,
                                             &val, exc_obj, &src_obj,
                                             &argc)))
        return 0;

    /* 
     *   We got the property.  If it's a string or an object containing a
     *   string, retrieve the string.
     */
    switch(val.typ)
    {
    case VM_SSTRING:
        /* get the constant string */
        str = G_const_pool->get_ptr(val.val.ofs);
        break;

    case VM_OBJ:
        /* get the string value of the object, if possible */
        str = vm_objp(vmg_ val.val.obj)->get_as_string(vmg0_);
        break;

    default:
        /* it's not a string - we can't use it */
        str = 0;
        break;
    }

    /* check to see if we got a string */
    if (str != 0)
    {
        /* 
         *   The string is in the standard VM internal format, which means
         *   it has a 2-byte length prefix followed by the bytes of the
         *   string (with no null termination).  Read the length prefix,
         *   then skip past it so the caller doesn't have to.  
         */
        *msg_len = osrp2(str);
        str += VMB_LEN;
    }

    /* return the string pointer */
    return str;
}